

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O1

string * llvm::sys::getProcessTriple_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StringRef Str;
  bool bVar2;
  char *unaff_RBX;
  string *in_RDI;
  size_t unaff_R12;
  string TargetTripleString;
  Triple PT;
  string local_e8;
  string local_c8;
  Triple local_a8;
  Triple local_70;
  Twine local_38;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  updateTripleOSVersion(&local_e8,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  Str.Length = unaff_R12;
  Str.Data = unaff_RBX;
  Triple::normalize_abi_cxx11_(Str);
  Twine::Twine(&local_38,&local_a8.Data);
  Triple::Triple(&local_70,&local_38);
  paVar1 = &local_a8.Data.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.Data._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.Data._M_dataplus._M_p,local_a8.Data.field_2._M_allocated_capacity + 1);
  }
  bVar2 = Triple::isArch32Bit(&local_70);
  if (bVar2) {
    Triple::get64BitArchVariant(&local_a8,&local_70);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_a8);
    local_70.Arch = local_a8.Arch;
    local_70.SubArch = local_a8.SubArch;
    local_70.Vendor = local_a8.Vendor;
    local_70.OS = local_a8.OS;
    local_70.Environment = local_a8.Environment;
    local_70.ObjectFormat = local_a8.ObjectFormat;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.Data._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8.Data._M_dataplus._M_p,local_a8.Data.field_2._M_allocated_capacity + 1
                     );
    }
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char*>();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.Data._M_dataplus._M_p != &local_70.Data.field_2) {
    operator_delete(local_70.Data._M_dataplus._M_p,local_70.Data.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  return in_RDI;
}

Assistant:

std::string sys::getProcessTriple() {
  std::string TargetTripleString = updateTripleOSVersion(LLVM_HOST_TRIPLE);
  Triple PT(Triple::normalize(TargetTripleString));

  if (sizeof(void *) == 8 && PT.isArch32Bit())
    PT = PT.get64BitArchVariant();
  if (sizeof(void *) == 4 && PT.isArch64Bit())
    PT = PT.get32BitArchVariant();

  return PT.str();
}